

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O2

void ssh_sent(Plug *plug,size_t bufsize)

{
  if (bufsize < 0x8000) {
    ssh_throttle_all((Ssh *)(plug + -5),false,bufsize);
    queue_idempotent_callback((IdempotentCallback *)(plug + 0x29));
    ssh_sendbuffer_changed((Ssh *)(plug + -5));
    return;
  }
  return;
}

Assistant:

static void ssh_sent(Plug *plug, size_t bufsize)
{
    Ssh *ssh = container_of(plug, Ssh, plug);
    /*
     * If the send backlog on the SSH socket itself clears, we should
     * unthrottle the whole world if it was throttled. Also trigger an
     * extra call to the consumer of the BPP's output, to try to send
     * some more data off its bufchain.
     */
    if (bufsize < SSH_MAX_BACKLOG) {
        ssh_throttle_all(ssh, false, bufsize);
        queue_idempotent_callback(&ssh->ic_out_raw);
        ssh_sendbuffer_changed(ssh);
    }
}